

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O2

void __thiscall helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_trade *m)

{
  uint uVar1;
  iterator iVar2;
  ulong uVar3;
  ulong uVar4;
  trade t;
  undefined1 local_70 [64];
  trade local_30;
  
  local_70._0_8_ = ZEXT28(m->StockLocate);
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,(key_type *)local_70);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    uVar1 = m->Price;
    local_30.price =
         (uint64_t)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    uVar1 = m->Shares;
    local_30.size =
         (uint64_t)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    uVar3 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar4 = (ulong)*(uint6 *)&m->field_0x5;
    local_30.timestamp =
         ((uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8
          | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38) >> 0x10;
    local_30.sign = non_displayable;
    make_trade_event((event *)local_70,
                     (string *)
                     ((long)iVar2.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                            ._M_cur + 0x10),local_30.timestamp,&local_30,0);
    std::function<void_(const_helix::event_&)>::operator()(&this->_process_event,(event *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_trade* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        uint64_t trade_price = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        auto& ob = it->second;
        auto timestamp = itch50_timestamp(m->Timestamp);
        trade t{timestamp, trade_price, quantity, trade_sign::non_displayable};
        _process_event(make_trade_event(ob.symbol(), timestamp, &t));
    }
}